

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O1

void __thiscall
loser_tree<int>::
loser_tree<__gnu_cxx::__normal_iterator<std::pair<int*,unsigned_long>*,std::vector<std::pair<int*,unsigned_long>,std::allocator<std::pair<int*,unsigned_long>>>>>
          (loser_tree<int> *this,
          __normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
          begin,__normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
                end)

{
  Stream *pSVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = (ulong)((long)end._M_current - (long)begin._M_current) >> 4;
  uVar3 = (uint)uVar6;
  iVar2 = 0x1f;
  if (uVar3 - 1 != 0) {
    for (; uVar3 - 1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  uVar7 = 2 << ((byte)iVar2 & 0x1f);
  this->_nodes = (uint *)0x0;
  this->_streams = (Stream *)0x0;
  this->_nonempty_streams = uVar3;
  this->_stream_offset = uVar7;
  if (1 < uVar3) {
    puVar4 = (uint *)malloc(0x14L << (-(((byte)iVar2 ^ 0x1f) + 0x20) & 0x3f));
    this->_nodes = puVar4;
    pSVar1 = (Stream *)(puVar4 + uVar7);
    this->_streams = pSVar1;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&pSVar1->stream + lVar5) =
           *(undefined8 *)((long)&(begin._M_current)->first + lVar5);
      *(undefined8 *)((long)&pSVar1->n + lVar5) =
           *(undefined8 *)((long)&(begin._M_current)->second + lVar5);
      lVar5 = lVar5 + 0x10;
    } while ((uVar6 & 0xffffffff) << 4 != lVar5);
    memset(pSVar1 + (uVar6 & 0xffffffff),0,(ulong)(uVar7 - uVar3) << 4);
    uVar3 = init_min(this,1);
    *this->_nodes = uVar3;
    return;
  }
  __assert_fail("_nonempty_streams>1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/losertree.h"
                ,0x53,
                "loser_tree<int>::loser_tree(Iterator, Iterator) [T = int, Iterator = __gnu_cxx::__normal_iterator<std::pair<int *, unsigned long> *, std::vector<std::pair<int *, unsigned long>>>]"
               );
}

Assistant:

loser_tree(Iterator begin, Iterator end)
		: _nodes(0), _streams(0), _nonempty_streams(end-begin),
		  _stream_offset(1 << (log2(_nonempty_streams-1)+1))
	{
		assert(_nonempty_streams>1);
		void* raw = malloc(_stream_offset*sizeof(unsigned) +
		                   _stream_offset*sizeof(Stream));
		_nodes = static_cast<unsigned*>(raw);
		_streams = reinterpret_cast<Stream*>(
				static_cast<char*>(raw) +
					_stream_offset*sizeof(unsigned));
		for (unsigned i=0; i < _nonempty_streams; ++i) {
			_streams[i].stream = begin[i].first;
			_streams[i].n      = begin[i].second;
		}
		(void) memset(_streams+_nonempty_streams, 0,
			(_stream_offset-_nonempty_streams)*sizeof(Stream));
		_nodes[0] = init_min(1);
		//debug()<<*this;
	}